

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

void HighsHashTree<int,_int>::erase_recurse(NodePtr *erase_node,uint64_t hash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  undefined8 *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  HighsHashTableEntry<int,_int> HVar10;
  HighsHashTableEntry<int,_int> HVar11;
  HighsHashTableEntry<int,_int> HVar12;
  HighsHashTableEntry<int,_int> HVar13;
  HighsHashTableEntry<int,_int> HVar14;
  undefined8 uVar15;
  bool bVar16;
  undefined8 *puVar17;
  uint64_t *puVar18;
  NodePtr NVar19;
  sbyte sVar20;
  long lVar21;
  uint uVar22;
  undefined8 *puVar23;
  InnerLeaf<4> *this;
  InnerLeaf<2> *this_00;
  InnerLeaf<3> *this_01;
  BranchNode *branch;
  uintptr_t uVar24;
  
  uVar2 = erase_node->ptrAndType;
  switch((uint)uVar2 & 7) {
  case 1:
    puVar23 = (undefined8 *)(uVar2 & 0xfffffffffffffff8);
    puVar17 = puVar23;
    do {
      puVar3 = (undefined8 *)*puVar17;
      if (*(int *)(puVar17 + 1) == *key) {
        *(int *)(puVar23 + 2) = *(int *)(puVar23 + 2) + -1;
        if (puVar3 != (undefined8 *)0x0) {
          uVar15 = puVar3[1];
          *puVar17 = *puVar3;
          puVar17[1] = uVar15;
          operator_delete(puVar3);
        }
        break;
      }
      puVar17 = puVar3;
    } while (puVar3 != (undefined8 *)0x0);
    iVar1 = *(int *)(puVar23 + 2);
    break;
  case 2:
    bVar16 = InnerLeaf<1>::erase_entry
                       ((InnerLeaf<1> *)(uVar2 & 0xfffffffffffffff8),hash,hashPos,key);
    if (!bVar16) {
      return;
    }
    iVar1 = ((InnerLeaf<1> *)(uVar2 & 0xfffffffffffffff8))->size;
    break;
  case 3:
    this_00 = (InnerLeaf<2> *)(uVar2 & 0xfffffffffffffff8);
    bVar16 = InnerLeaf<2>::erase_entry(this_00,hash,hashPos,key);
    if (!bVar16) {
      return;
    }
    if (this_00->size != 6) {
      return;
    }
    puVar18 = (uint64_t *)operator_new(0x78);
    *puVar18 = (this_00->occupation).occupation;
    *(undefined4 *)(puVar18 + 1) = 6;
    uVar4 = (this_00->hashes)._M_elems[6];
    uVar5 = (this_00->hashes)._M_elems[1];
    uVar6 = (this_00->hashes)._M_elems[2];
    uVar7 = (this_00->hashes)._M_elems[3];
    uVar8 = (this_00->hashes)._M_elems[4];
    uVar9 = (this_00->hashes)._M_elems[5];
    puVar18[2] = (this_00->hashes)._M_elems[0];
    puVar18[3] = uVar5;
    puVar18[8] = uVar4;
    puVar18[6] = uVar8;
    puVar18[7] = uVar9;
    puVar18[4] = uVar6;
    puVar18[5] = uVar7;
    HVar10 = (this_00->entries)._M_elems[0];
    HVar11 = (this_00->entries)._M_elems[1];
    HVar12 = (this_00->entries)._M_elems[2];
    HVar13 = (this_00->entries)._M_elems[3];
    HVar14 = (this_00->entries)._M_elems[5];
    *(HighsHashTableEntry<int,_int> *)(puVar18 + 0xd) = (this_00->entries)._M_elems[4];
    *(HighsHashTableEntry<int,_int> *)(puVar18 + 0xe) = HVar14;
    *(HighsHashTableEntry<int,_int> *)(puVar18 + 9) = HVar10;
    *(HighsHashTableEntry<int,_int> *)(puVar18 + 10) = HVar11;
    *(HighsHashTableEntry<int,_int> *)(puVar18 + 0xb) = HVar12;
    *(HighsHashTableEntry<int,_int> *)(puVar18 + 0xc) = HVar13;
    erase_node->ptrAndType = (ulong)puVar18 | 2;
    goto LAB_00271642;
  case 4:
    this_01 = (InnerLeaf<3> *)(uVar2 & 0xfffffffffffffff8);
    bVar16 = InnerLeaf<3>::erase_entry(this_01,hash,hashPos,key);
    if (!bVar16) {
      return;
    }
    if (this_01->size != 0x16) {
      return;
    }
    puVar18 = (uint64_t *)operator_new(0x178);
    *puVar18 = (this_01->occupation).occupation;
    *(undefined4 *)(puVar18 + 1) = 0x16;
    memmove(puVar18 + 2,&this_01->hashes,0xb8);
    memmove(puVar18 + 0x19,&this_01->entries,0xb0);
    uVar24 = (ulong)puVar18 | 3;
    goto LAB_0027163f;
  case 5:
    this = (InnerLeaf<4> *)(uVar2 & 0xfffffffffffffff8);
    bVar16 = InnerLeaf<4>::erase_entry(this,hash,hashPos,key);
    if (!bVar16) {
      return;
    }
    if (this->size != 0x26) {
      return;
    }
    puVar18 = (uint64_t *)operator_new(0x278);
    *puVar18 = (this->occupation).occupation;
    *(undefined4 *)(puVar18 + 1) = 0x26;
    memmove(puVar18 + 2,&this->hashes,0x138);
    memmove(puVar18 + 0x29,&this->entries,0x130);
    uVar24 = (ulong)puVar18 | 4;
LAB_0027163f:
    erase_node->ptrAndType = uVar24;
LAB_00271642:
    operator_delete((void *)(uVar2 & 0xfffffffffffffff8));
    return;
  case 6:
    branch = (BranchNode *)(uVar2 & 0xfffffffffffffff8);
    uVar22 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar2 = (branch->occupation).occupation;
    sVar20 = (sbyte)uVar22;
    if ((uVar2 >> uVar22 & 1) != 0) {
      lVar21 = POPCOUNT(uVar2 >> sVar20);
      erase_recurse(branch->child + lVar21 + -1,hash,hashPos + 1,key);
      if ((branch->child[lVar21 + -1].ptrAndType & 7) == 0) {
        (branch->occupation).occupation = (branch->occupation).occupation ^ 1L << sVar20;
        NVar19 = removeChildFromBranchNode(branch,(int)lVar21 + -1,hash,hashPos);
        erase_node->ptrAndType = (uintptr_t)NVar19;
      }
    }
  default:
    goto switchD_002714a5_default;
  }
  if (iVar1 == 0) {
    operator_delete((void *)(uVar2 & 0xfffffffffffffff8));
    erase_node->ptrAndType = 0;
  }
switchD_002714a5_default:
  return;
}

Assistant:

static void erase_recurse(NodePtr* erase_node, uint64_t hash, int hashPos,
                            const K& key) {
    switch (erase_node->getType()) {
      case kEmpty: {
        return;
      }
      case kListLeaf: {
        ListLeaf* leaf = erase_node->getListLeaf();

        // check for existing key
        ListNode* iter = &leaf->first;

        do {
          ListNode* next = iter->next;
          if (iter->entry.key() == key) {
            // key found, decrease count
            --leaf->count;
            if (next != nullptr) {
              // if we have a next node after replace the entry in iter by
              // moving that node into it
              *iter = std::move(*next);
              // delete memory of that node
              delete next;
            }

            break;
          }

          iter = next;
        } while (iter != nullptr);

        if (leaf->count == 0) {
          delete leaf;
          *erase_node = nullptr;
        }

        return;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = erase_node->getInnerLeafSizeClass1();
        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == 0) {
            delete leaf;
            *erase_node = nullptr;
          }
        }

        return;
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = erase_node->getInnerLeafSizeClass2();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<1>::capacity()) {
            InnerLeaf<1>* newLeaf = new InnerLeaf<1>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = erase_node->getInnerLeafSizeClass3();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<2>::capacity()) {
            InnerLeaf<2>* newLeaf = new InnerLeaf<2>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = erase_node->getInnerLeafSizeClass4();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<3>::capacity()) {
            InnerLeaf<3>* newLeaf = new InnerLeaf<3>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kBranchNode: {
        BranchNode* branch = erase_node->getBranchNode();

        if (!branch->occupation.test(get_hash_chunk(hash, hashPos))) return;

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
        erase_recurse(&branch->child[location], hash, hashPos + 1, key);

        if (branch->child[location].getType() != kEmpty) return;

        branch->occupation.flip(get_hash_chunk(hash, hashPos));

        *erase_node =
            removeChildFromBranchNode(branch, location, hash, hashPos);
        break;
      }
    }
  }